

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O1

void mk_http_cb_file_on_consume(mk_stream_input *in,long bytes)

{
  int iVar1;
  
  iVar1 = mk_socket_set_cork_flag(in->stream->channel->fd,0);
  if (iVar1 == -1) {
    mk_print(0x1002,"Could not set TCP_CORK/TCP_NOPUSH off");
  }
  in->cb_consumed = (_func_void_mk_stream_input_ptr_long *)0x0;
  return;
}

Assistant:

static inline void mk_http_cb_file_on_consume(struct mk_stream_input *in,
                                              long bytes)
{
    int ret;
    (void) bytes;

    /*
     * This callback is invoked just once as we want to turn off
     * the TCP Cork. We do this just overriding the callback for
     * the file stream.
     */
    ret = mk_server_cork_flag(in->stream->channel->fd, TCP_CORK_OFF);
    if (ret == -1) {
        mk_warn("Could not set TCP_CORK/TCP_NOPUSH off");
    }
    MK_TRACE("[FD %i] Disable TCP_CORK/TCP_NOPUSH",
             in->stream->channel->fd);
    in->cb_consumed = NULL;
}